

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O1

bool __thiscall
CoreML::Specification::SimpleRecurrentLayerParams::MergePartialFromCodedStream
          (SimpleRecurrentLayerParams *this,CodedInputStream *input)

{
  byte *pbVar1;
  byte bVar2;
  byte *pbVar3;
  bool bVar4;
  short extraout_AX;
  short extraout_AX_00;
  short extraout_AX_01;
  short sVar5;
  int iVar6;
  uint uVar7;
  uint32 uVar8;
  WeightParams *pWVar9;
  ulong extraout_RAX;
  ulong extraout_RAX_00;
  ActivationParams *this_00;
  ulong extraout_RAX_01;
  ulong extraout_RAX_02;
  uint8 *puVar10;
  char cVar11;
  uint uVar12;
  ulong uVar13;
  pair<unsigned_long,_bool> pVar14;
  int local_64;
  
  do {
    pbVar3 = input->buffer_;
    uVar8 = 0;
    if (pbVar3 < input->buffer_end_) {
      bVar2 = *pbVar3;
      pbVar1 = pbVar3 + 1;
      uVar12 = (uint)bVar2;
      if ((char)bVar2 < '\x01') {
        uVar8 = (uint)bVar2;
        if ((input->buffer_end_ <= pbVar1) ||
           (uVar8 = (uint)bVar2, (~(uint)*pbVar1 & uVar12) < 0x80)) goto LAB_004a150b;
        uVar12 = ((uint)bVar2 + (uint)*pbVar1 * 0x80) - 0x80;
        input->buffer_ = pbVar3 + 2;
      }
      else {
        input->buffer_ = pbVar1;
      }
      uVar13 = (ulong)uVar12 | 0x100000000;
    }
    else {
LAB_004a150b:
      uVar8 = google::protobuf::io::CodedInputStream::ReadTagFallback(input,uVar8);
      uVar13 = 0;
      if (uVar8 - 1 < 0x3fff) {
        uVar13 = 0x100000000;
      }
      uVar13 = uVar8 | uVar13;
    }
    uVar12 = (uint)uVar13;
    if ((uVar13 & 0x100000000) == 0) goto LAB_004a124a;
    uVar7 = (uint)(uVar13 >> 3) & 0x1fffffff;
    cVar11 = (char)uVar13;
    if (uVar7 < 0x14) {
      if (9 < uVar7) {
        if (uVar7 == 10) {
          if (cVar11 == 'R') {
            if (this->activation_ == (ActivationParams *)0x0) {
              this_00 = (ActivationParams *)operator_new(0x20);
              ActivationParams::ActivationParams(this_00);
              this->activation_ = this_00;
            }
            MergePartialFromCodedStream();
            uVar13 = extraout_RAX_01;
            goto LAB_004a140b;
          }
        }
        else if (uVar7 == 0xf) {
          MergePartialFromCodedStream();
          sVar5 = extraout_AX_01;
          goto LAB_004a14bf;
        }
        goto LAB_004a124a;
      }
      if (uVar7 == 1) {
        if (cVar11 != '\b') goto LAB_004a124a;
        puVar10 = input->buffer_;
        if ((input->buffer_end_ <= puVar10) || ((long)(char)*puVar10 < 0)) {
          pVar14 = google::protobuf::io::CodedInputStream::ReadVarint64Fallback(input);
          this->inputvectorsize_ = pVar14.first;
          goto LAB_004a14f8;
        }
        this->inputvectorsize_ = (long)(char)*puVar10;
LAB_004a1444:
        input->buffer_ = puVar10 + 1;
      }
      else {
        if ((uVar7 != 2) || (cVar11 != '\x10')) goto LAB_004a124a;
        puVar10 = input->buffer_;
        if ((puVar10 < input->buffer_end_) && (-1 < (long)(char)*puVar10)) {
          this->outputvectorsize_ = (long)(char)*puVar10;
          goto LAB_004a1444;
        }
        pVar14 = google::protobuf::io::CodedInputStream::ReadVarint64Fallback(input);
        this->outputvectorsize_ = pVar14.first;
LAB_004a14f8:
        if (((undefined1  [16])pVar14 & (undefined1  [16])0x1) == (undefined1  [16])0x0)
        goto LAB_004a1501;
      }
LAB_004a1275:
      iVar6 = 0;
    }
    else {
      if (uVar7 < 0x1f) {
        if (uVar7 == 0x1e) {
          if (cVar11 == -0xe) {
            if (this->weightmatrix_ == (WeightParams *)0x0) {
              pWVar9 = (WeightParams *)operator_new(0x50);
              WeightParams::WeightParams(pWVar9);
              this->weightmatrix_ = pWVar9;
            }
            MergePartialFromCodedStream();
            uVar13 = extraout_RAX_00;
            goto LAB_004a140b;
          }
        }
        else if (uVar7 == 0x14) {
          MergePartialFromCodedStream();
          sVar5 = extraout_AX_00;
LAB_004a14bf:
          if (sVar5 != 0) {
            iVar6 = 6;
            if (sVar5 != 1) goto LAB_004a1275;
            goto LAB_004a1277;
          }
        }
        goto LAB_004a124a;
      }
      if (uVar7 == 0x1f) {
        if (cVar11 != -6) goto LAB_004a124a;
        if (this->recursionmatrix_ == (WeightParams *)0x0) {
          pWVar9 = (WeightParams *)operator_new(0x50);
          WeightParams::WeightParams(pWVar9);
          this->recursionmatrix_ = pWVar9;
        }
        MergePartialFromCodedStream();
        uVar13 = extraout_RAX_02;
LAB_004a140b:
        iVar6 = local_64;
        if ((uVar13 & 1) == 0) goto LAB_004a1275;
      }
      else {
        if (uVar7 == 0x20) {
          if (cVar11 == '\x02') {
            if (this->biasvector_ == (WeightParams *)0x0) {
              pWVar9 = (WeightParams *)operator_new(0x50);
              WeightParams::WeightParams(pWVar9);
              this->biasvector_ = pWVar9;
            }
            MergePartialFromCodedStream();
            uVar13 = extraout_RAX;
            goto LAB_004a140b;
          }
LAB_004a124a:
          iVar6 = 7;
          if ((uVar12 & 7) == 4 || uVar12 == 0) goto LAB_004a1277;
          bVar4 = google::protobuf::internal::WireFormatLite::SkipField(input,uVar12);
          if (bVar4) goto LAB_004a1275;
        }
        else {
          if (uVar7 != 100) goto LAB_004a124a;
          MergePartialFromCodedStream();
          if (extraout_AX != 1) {
            if (extraout_AX != 0) goto LAB_004a1275;
            goto LAB_004a124a;
          }
        }
LAB_004a1501:
        iVar6 = 6;
      }
    }
LAB_004a1277:
    if (iVar6 != 0) {
      return iVar6 != 6;
    }
  } while( true );
}

Assistant:

bool SimpleRecurrentLayerParams::MergePartialFromCodedStream(
    ::google::protobuf::io::CodedInputStream* input) {
#define DO_(EXPRESSION) if (!GOOGLE_PREDICT_TRUE(EXPRESSION)) goto failure
  ::google::protobuf::uint32 tag;
  // @@protoc_insertion_point(parse_start:CoreML.Specification.SimpleRecurrentLayerParams)
  for (;;) {
    ::std::pair< ::google::protobuf::uint32, bool> p = input->ReadTagWithCutoffNoLastTag(16383u);
    tag = p.first;
    if (!p.second) goto handle_unusual;
    switch (::google::protobuf::internal::WireFormatLite::GetTagFieldNumber(tag)) {
      // uint64 inputVectorSize = 1;
      case 1: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(8u)) {

          DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<
                   ::google::protobuf::uint64, ::google::protobuf::internal::WireFormatLite::TYPE_UINT64>(
                 input, &inputvectorsize_)));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // uint64 outputVectorSize = 2;
      case 2: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(16u)) {

          DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<
                   ::google::protobuf::uint64, ::google::protobuf::internal::WireFormatLite::TYPE_UINT64>(
                 input, &outputvectorsize_)));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // .CoreML.Specification.ActivationParams activation = 10;
      case 10: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(82u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
               input, mutable_activation()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // bool sequenceOutput = 15;
      case 15: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(120u)) {

          DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<
                   bool, ::google::protobuf::internal::WireFormatLite::TYPE_BOOL>(
                 input, &sequenceoutput_)));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // bool hasBiasVector = 20;
      case 20: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(160u)) {

          DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<
                   bool, ::google::protobuf::internal::WireFormatLite::TYPE_BOOL>(
                 input, &hasbiasvector_)));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // .CoreML.Specification.WeightParams weightMatrix = 30;
      case 30: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(242u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
               input, mutable_weightmatrix()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // .CoreML.Specification.WeightParams recursionMatrix = 31;
      case 31: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(250u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
               input, mutable_recursionmatrix()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // .CoreML.Specification.WeightParams biasVector = 32;
      case 32: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(258u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
               input, mutable_biasvector()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // bool reverseInput = 100;
      case 100: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(800u)) {

          DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<
                   bool, ::google::protobuf::internal::WireFormatLite::TYPE_BOOL>(
                 input, &reverseinput_)));
        } else {
          goto handle_unusual;
        }
        break;
      }

      default: {
      handle_unusual:
        if (tag == 0 ||
            ::google::protobuf::internal::WireFormatLite::GetTagWireType(tag) ==
            ::google::protobuf::internal::WireFormatLite::WIRETYPE_END_GROUP) {
          goto success;
        }
        DO_(::google::protobuf::internal::WireFormatLite::SkipField(input, tag));
        break;
      }
    }
  }
success:
  // @@protoc_insertion_point(parse_success:CoreML.Specification.SimpleRecurrentLayerParams)
  return true;
failure:
  // @@protoc_insertion_point(parse_failure:CoreML.Specification.SimpleRecurrentLayerParams)
  return false;
#undef DO_
}